

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrcmp.cpp
# Opt level: O2

void __thiscall CVmObjStrComp::load_from_stream(CVmObjStrComp *this,CVmStream *str)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  CVmObjStrCompMapReaderStream reader;
  CVmObjStrCompMapReader local_38;
  CVmStream *local_30;
  
  uVar1 = (*str->_vptr_CVmStream[6])(str);
  uVar2 = (*str->_vptr_CVmStream[6])(str);
  uVar3 = (*str->_vptr_CVmStream[6])(str);
  uVar4 = (*str->_vptr_CVmStream[6])(str);
  local_38._vptr_CVmObjStrCompMapReader = (_func_int **)&PTR_read_mapping_0031ff58;
  local_30 = str;
  alloc_ext(this,(ulong)uVar1,uVar2 & 1,(ulong)uVar3,(ulong)uVar4,&local_38);
  return;
}

Assistant:

void CVmObjStrComp::load_from_stream(VMG_ CVmStream *str)
{
    unsigned int trunc_len;
    unsigned int flags;
    unsigned int equiv_cnt;
    unsigned int total_chars;
    
    /* load the fixed header */
    trunc_len = str->read_uint2();
    flags = str->read_uint2();
    equiv_cnt = str->read_uint2();
    total_chars = str->read_uint2();

    /* set up a stream-based mapping reader */
    CVmObjStrCompMapReaderStream reader(str);

    /* allocate and initialize our extension */
    alloc_ext(vmg_ trunc_len, (flags & 0x0001) != 0, equiv_cnt, total_chars,
              &reader);
}